

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O3

void * __thiscall axl::sys::TlsMgr::setSlotValue(TlsMgr *this,size_t slot,TlsValue *value)

{
  BoxListEntry<axl::rc::Ptr<void>_> *pBVar1;
  void *pvVar2;
  bool bVar3;
  Page *this_00;
  Iterator IVar4;
  BoxListEntry<axl::rc::Ptr<void>_> **ppBVar5;
  Ptr<void> local_30;
  
  this_00 = getCurrentThreadPage(this);
  if ((this_00->m_array).
      super_ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
      .m_count <= slot) {
    if (value->m_p == (void *)0x0) {
      return (void *)0x0;
    }
    sl::
    Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
    ::
    setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>::ZeroConstruct>
              ((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
                *)this_00,slot + 1);
  }
  pBVar1 = (this_00->m_array).
           super_ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
           .m_p[slot];
  if (pBVar1 == (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
    if (value->m_p == (void *)0x0) {
      return (void *)0x0;
    }
    IVar4 = sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::insertTail
                      (&this_00->m_valueList,value);
    bVar3 = sl::
            Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
            ::ensureExclusive(&this_00->m_array);
    ppBVar5 = (BoxListEntry<axl::rc::Ptr<void>_> **)0x0;
    if (bVar3) {
      ppBVar5 = (this_00->m_array).
                super_ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                .m_p;
    }
    ((BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
      *)(ppBVar5 + slot))->
    super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
         = (IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
            )IVar4.
             super_BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
             .
             super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
             .m_p;
    return (void *)0x0;
  }
  pvVar2 = (pBVar1->m_value).m_p;
  if ((EVP_PKEY_CTX *)value->m_p == (EVP_PKEY_CTX *)0x0) {
    sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::remove
              ((BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *)&local_30,
               (char *)&this_00->m_valueList);
    rc::Ptr<void>::clear(&local_30);
    bVar3 = sl::
            Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
            ::ensureExclusive(&this_00->m_array);
    if (bVar3) {
      ppBVar5 = (this_00->m_array).
                super_ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                .m_p;
    }
    else {
      ppBVar5 = (BoxListEntry<axl::rc::Ptr<void>_> **)0x0;
    }
    ppBVar5[slot] = (BoxListEntry<axl::rc::Ptr<void>_> *)0x0;
    return pvVar2;
  }
  rc::Ptr<void>::copy(&pBVar1->m_value,(EVP_PKEY_CTX *)value->m_p,(EVP_PKEY_CTX *)value->m_refCount)
  ;
  return pvVar2;
}

Assistant:

void*
TlsMgr::setSlotValue(
	size_t slot,
	const TlsValue& value
) {
	Page* page = getCurrentThreadPage();

	size_t count = page->m_array.getCount();
	if (slot >= count) {
		if (!value)
			return NULL;

		page->m_array.setCountZeroConstruct(slot + 1);
	}

	sl::BoxListEntry<TlsValue>* entry = page->m_array[slot];

	void* prev = NULL;

	if (entry) {
		prev = entry->m_value;

		if (value) {
			entry->m_value = value;
		} else {
			page->m_valueList.remove(entry);
			page->m_array.rwi()[slot] = NULL;
		}
	} else if (value) {
		entry = page->m_valueList.insertTail(value).getEntry();
		page->m_array.rwi()[slot] = entry;
	}

	return prev;
}